

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O1

void maybe_tutorial(void)

{
  ushort uVar1;
  monst *pmVar2;
  level *plVar3;
  schar sVar4;
  boolean bVar5;
  char cVar6;
  int iVar7;
  obj *poVar8;
  long lVar9;
  uint uVar10;
  int dy;
  int iVar11;
  uint lx;
  int iVar12;
  bool bVar13;
  bool bVar14;
  int local_44;
  uint local_40;
  uint local_3c;
  
  if (flags.tutorial == '\0') {
    return;
  }
  if (pl_tutorial[0] < '\x01') {
    pl_tutorial[0] = '\x01';
    tutorial_latest_message = 0xc9;
  }
  else {
    if (3 < moves) {
      bVar13 = false;
      local_44 = -1;
      iVar12 = -1;
      do {
        iVar11 = -1;
        do {
          plVar3 = level;
          if (((iVar12 + u.ux) - 1U < 0x4f) && (uVar10 = u.uy + iVar11, uVar10 < 0x15)) {
            lx = u.ux + iVar12;
            bVar14 = false;
            bVar5 = check_tutorial_location(lx,uVar10,'\0');
            if (bVar5 == '\0') {
              if ((((plVar3->locations[lx][uVar10].field_0x6 & 8) == 0) || (flags.tutorial == '\0'))
                 || ('\0' < pl_tutorial[0xc])) {
                iVar7 = dbuf_get_mon(lx,uVar10);
                bVar14 = true;
                if (iVar7 != 0) {
                  iVar7 = dbuf_get_mon(lx,uVar10);
                  if (((local_44 == iVar7 + -1) && (flags.tutorial != '\0')) &&
                     (pl_tutorial[0x44] < '\x01')) {
                    pl_tutorial[0x44] = '\x01';
                    tutorial_latest_message = 0x10d;
                    iVar7 = 0x10d;
                    goto LAB_0026ecf8;
                  }
                  local_44 = dbuf_get_mon(lx,uVar10);
                  local_44 = local_44 + -1;
                }
              }
              else {
                pl_tutorial[0xc] = '\x01';
                tutorial_latest_message = 0xd5;
                iVar7 = 0xd5;
LAB_0026ecf8:
                com_pager(iVar7);
                bVar14 = false;
              }
            }
            if (!bVar14) {
              if (!bVar13) {
                return;
              }
              goto LAB_0026ed61;
            }
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 2);
        iVar11 = iVar12 + 1;
        bVar13 = 0 < iVar12;
        iVar12 = iVar11;
      } while (iVar11 != 2);
    }
LAB_0026ed61:
    iVar12 = tutorial_last_combat;
    tutorial_last_combat = tutorial_last_combat + 1;
    for (pmVar2 = level->monlist; pmVar2 != (monst *)0x0; pmVar2 = pmVar2->nmon) {
      if (((0 < pmVar2->mhp) && ((viz_array[pmVar2->my][pmVar2->mx] & 2U) != 0)) &&
         (pmVar2->mtame == '\0')) {
        tutorial_last_combat = 0;
      }
    }
    if (4 < iVar12 && tutorial_last_combat == 0) {
      if (((('\x02' < u.uz.dlevel) && (flags.elbereth_enabled != '\0')) && (flags.tutorial != '\0'))
         && (pl_tutorial[0x5c] < '\x01')) {
        pl_tutorial[0x5c] = '\x01';
        tutorial_latest_message = 0x125;
        goto LAB_0026ed3d;
      }
      lVar9 = 0;
      do {
        if (spl_book[lVar9].sp_id == 0x187) {
          if (pl_tutorial[0x59] < '\x01' && flags.tutorial != '\0') {
            pl_tutorial[0x59] = '\x01';
            tutorial_latest_message = 0x122;
            goto LAB_0026ed3d;
          }
        }
        else if (spl_book[lVar9].sp_id == 0) break;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x2b);
      if ((flags.tutorial != '\0') && (pl_tutorial[0x5d] < '\x01')) {
        pl_tutorial[0x5d] = '\x01';
        tutorial_latest_message = 0x126;
        goto LAB_0026ed3d;
      }
    }
    if (((spl_book[1].sp_id == 0) ||
        (((((uarm == (obj *)0x0 ||
            (6 < (ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) &&
           ((uarms == (obj *)0x0 || (urole.malenum == 0x161)))) &&
          ((((uarmh == (obj *)0x0 || ((long)uarmh->otyp == 0x51)) ||
            ((ushort)((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) - 0x12) < 0xfff9))
           && ((uarmg == (obj *)0x0 ||
               (6 < (ushort)((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) - 0xb)))))))
         && ((uarmf == (obj *)0x0 ||
             (6 < (ushort)((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) - 0xb))))))) ||
       ((flags.tutorial == '\0' || ('\0' < pl_tutorial[0x8b])))) {
      if (((uwep == &zeroobj || uwep == (obj *)0x0) ||
          (((iVar11 = weapon_dam_bonus(uwep), -1 < iVar11 || (u.twoweap != '\0')) ||
           (flags.tutorial == '\0')))) || ('\0' < pl_tutorial[0x8c])) {
        sVar4 = tutorial_old_attribs.a[0];
        if (((u.ulevel < 2) || (flags.tutorial == '\0')) || ('\0' < pl_tutorial[0x77])) {
          if (((u.ulevel < 3) || (flags.tutorial == '\0')) || ('\0' < pl_tutorial[0x78])) {
            lVar9 = 0;
            iVar11 = 0;
            do {
              cVar6 = u.acurr.a[lVar9];
              if (tutorial_old_attribs.a[lVar9] < cVar6) {
                iVar11 = 1;
              }
              if (cVar6 < tutorial_old_attribs.a[lVar9]) {
                iVar11 = -1;
              }
              tutorial_old_attribs.a[lVar9] = cVar6;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 6);
            if (sVar4 != '\0') {
              if (((0 < iVar11) && (flags.tutorial != '\0')) && (pl_tutorial[0x79] < '\x01')) {
                pl_tutorial[0x79] = '\x01';
                tutorial_latest_message = 0x142;
                goto LAB_0026ed3d;
              }
              if (((iVar11 < 0) && (flags.tutorial != '\0')) && (pl_tutorial[0x7a] < '\x01')) {
                pl_tutorial[0x7a] = '\x01';
                tutorial_latest_message = 0x143;
                goto LAB_0026ed3d;
              }
            }
            if (((tutorial_old_ac == 300 || tutorial_old_ac <= u.uac) || (flags.tutorial == '\0'))
               || ('\0' < pl_tutorial[0x7f])) {
              tutorial_old_ac = (int)u.uac;
              if ((((u.uprops[0x1d].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0) &&
                   ((((u.uprops[0x1e].intrinsic == 0 &&
                      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    ((u.uprops[0x1b].intrinsic == 0 &&
                     ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))))))) &&
                  ((((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
                    ((u.umonnum != u.umonster &&
                     (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))) &&
                   (u.uprops[0x3a].intrinsic == 0)))) ||
                 ((flags.tutorial == '\0' || ('\0' < pl_tutorial[0x83])))) {
                if (((u.uz.dlevel < '\x02') || (flags.tutorial == '\0')) ||
                   ('\0' < pl_tutorial[0x7b])) {
                  if (((u.uz.dlevel < '\n') || (flags.tutorial == '\0')) ||
                     ('\0' < pl_tutorial[0x4a])) {
                    if (((u.uhp < u.uhpmax) && (flags.tutorial != '\0')) &&
                       (pl_tutorial[0x7c] < '\x01')) {
                      pl_tutorial[0x7c] = '\x01';
                      tutorial_latest_message = 0x145;
                    }
                    else if (((u.uen < u.uenmax) && (flags.tutorial != '\0')) &&
                            (pl_tutorial[0x7d] < '\x01')) {
                      pl_tutorial[0x7d] = '\x01';
                      tutorial_latest_message = 0x146;
                    }
                    else if (((u.uen < 5) && (10 < u.uenmax)) &&
                            ((flags.tutorial != '\0' && (pl_tutorial[0x7e] < '\x01')))) {
                      pl_tutorial[0x7e] = '\x01';
                      tutorial_latest_message = 0x147;
                    }
                    else if (((u.umonster == u.umonnum) || (flags.tutorial == '\0')) ||
                            ('\0' < pl_tutorial[0x85])) {
                      if (((u.uexp < 1) || (flags.tutorial == '\0')) || ('\0' < pl_tutorial[0x80]))
                      {
                        if (((u.uhs < 2) || (flags.tutorial == '\0')) || ('\0' < pl_tutorial[0x81]))
                        {
                          if (((u.uhs == 0) && (flags.tutorial != '\0')) &&
                             (pl_tutorial[0x82] < '\x01')) {
                            pl_tutorial[0x82] = '\x01';
                            tutorial_latest_message = 0x14b;
                          }
                          else {
                            bVar5 = can_advance_something();
                            if (((bVar5 == '\0') || (flags.tutorial == '\0')) ||
                               ('\0' < pl_tutorial[0x84])) {
                              if ((((u._1052_1_ & 1) == 0) || (flags.tutorial == '\0')) ||
                                 ('\0' < pl_tutorial[0x8d])) {
                                iVar11 = near_capacity();
                                if (((iVar11 < 1) || (flags.tutorial == '\0')) ||
                                   ('\0' < pl_tutorial[0x88])) {
                                  iVar11 = in_trouble();
                                  if ((((iVar11 < 1) || (bVar5 = can_pray('\0'), bVar5 == '\0')) ||
                                      (level->locations[u.ux][u.uy].typ == '!')) ||
                                     ((flags.tutorial == '\0' || ('\0' < pl_tutorial[0x87])))) {
                                    cVar6 = inside_shop(level,u.ux,u.uy);
                                    if (((cVar6 == '\0') || (flags.tutorial == '\0')) ||
                                       ('\0' < pl_tutorial[0x9f])) {
                                      if (((u.uz.dnum == dungeon_topology.d_mines_dnum) &&
                                          (flags.tutorial != '\0')) && (pl_tutorial[0xa1] < '\x01'))
                                      {
                                        pl_tutorial[0xa1] = '\x01';
                                        tutorial_latest_message = 0x16a;
                                      }
                                      else if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
                                               (flags.tutorial != '\0')) &&
                                              (pl_tutorial[0xa2] < '\x01')) {
                                        pl_tutorial[0xa2] = '\x01';
                                        tutorial_latest_message = 0x16b;
                                      }
                                      else if (((check_tutorial_command_message == 0x112) &&
                                               (flags.tutorial != '\0')) &&
                                              (pl_tutorial[0x49] < '\x01')) {
                                        pl_tutorial[0x49] = '\x01';
                                        tutorial_latest_message = 0x112;
                                      }
                                      else {
                                        if (invent != (obj *)0x0) {
                                          bVar13 = flags.tutorial != '\0';
                                          local_40 = 0;
                                          local_3c = 0;
                                          poVar8 = invent;
                                          do {
                                            if ((((~*(uint *)&poVar8->field_0x4a & 0x41) == 0) &&
                                                (flags.tutorial != '\0')) &&
                                               (pl_tutorial[0x89] < '\x01')) {
                                              pl_tutorial[0x89] = '\x01';
                                              tutorial_latest_message = 0x152;
                                              goto LAB_0026ed3d;
                                            }
                                            if (((poVar8->oartifact != '\0') &&
                                                (flags.tutorial != '\0')) &&
                                               (pl_tutorial[0x75] < '\x01')) {
                                              pl_tutorial[0x75] = '\x01';
                                              tutorial_latest_message = 0x13e;
                                              goto LAB_0026ed3d;
                                            }
                                            if ((((poVar8->field_0x4a & 4) != 0) &&
                                                (flags.tutorial != '\0')) &&
                                               (pl_tutorial[0xa0] < '\x01')) {
                                              pl_tutorial[0xa0] = '\x01';
                                              tutorial_latest_message = 0x169;
                                              goto LAB_0026ed3d;
                                            }
                                            uVar1 = poVar8->otyp;
                                            if ((objects[(short)uVar1].field_0x10 & 1) == 0) {
                                              switch(objects[(short)uVar1].oc_class) {
                                              case '\x04':
                                              case '\x05':
switchD_0026f726_caseD_4:
                                                if (pl_tutorial[0x76] < '\x01' && bVar13) {
LAB_0026fa4e:
                                                  pl_tutorial[0x76] = '\x01';
                                                  tutorial_latest_message = 0x13f;
                                                  goto LAB_0026ed3d;
                                                }
                                                break;
                                              case '\b':
                                                if ((uVar1 != 0x14f) && (uVar1 != 0x17c))
                                                goto switchD_0026f726_caseD_a;
                                                break;
                                              case '\t':
                                                if ((1 < uVar1 - 0x1bc) && (uVar1 != 0x17c))
                                                goto switchD_0026f726_caseD_4;
                                                break;
                                              case '\n':
                                              case '\v':
switchD_0026f726_caseD_a:
                                                if ((uVar1 & 0xfffe) != 0x1bc &&
                                                    (pl_tutorial[0x76] < '\x01' && bVar13))
                                                goto LAB_0026fa4e;
                                              }
                                            }
                                            uVar10 = (ushort)poVar8->otyp - 0xda;
                                            if ((uVar10 < 7) &&
                                               ((((0x6bU >> (uVar10 & 0x1f) & 1) != 0 ||
                                                 (((uVar10 == 4 && (urole.malenum != 0x159)) &&
                                                  (urole.malenum != 0x164)))) &&
                                                (pl_tutorial[0x6c] < '\x01' && bVar13))))
                                            goto LAB_0026f94a;
                                            if (tutorial_last_combat == 0 && 4 < iVar12) {
                                              uVar1 = poVar8->otyp;
                                              uVar10 = (uint)uVar1;
                                              if (uVar1 < 0x42) {
                                                if (uVar10 < 0x15) {
                                                  if ((0x1ebf80U >> (uVar10 & 0x1f) & 1) == 0) {
                                                    if ((0x3eU >> (uVar10 & 0x1f) & 1) == 0) {
                                                      if (uVar10 == 6) {
                                                        local_3c = local_3c | 2;
                                                      }
                                                    }
                                                    else {
                                                      local_3c = local_3c | 1;
                                                    }
                                                  }
                                                  else if (((poVar8 != uwep) &&
                                                           (flags.tutorial != '\0')) &&
                                                          (pl_tutorial[0x5a] < '\x01')) {
                                                    pl_tutorial[0x5a] = '\x01';
                                                    tutorial_latest_message = 0x123;
                                                    goto LAB_0026ed3d;
                                                  }
                                                }
                                              }
                                              else if (uVar1 < 0x46) {
                                                local_40 = local_40 | 1;
                                              }
                                              else if (uVar1 - 0x212 < 2) {
                                                local_3c = local_3c | 4;
                                              }
                                              else if (uVar10 == 0x46) {
                                                local_40 = local_40 | 4;
                                              }
                                              else if (uVar10 == 0x47) {
                                                local_40 = local_40 | 2;
                                              }
                                            }
                                            poVar8 = poVar8->nobj;
                                          } while (poVar8 != (obj *)0x0);
                                          if ((((local_40 & local_3c) != 0) &&
                                              (flags.tutorial != '\0')) &&
                                             (pl_tutorial[0x5b] < '\x01')) {
                                            pl_tutorial[0x5b] = '\x01';
                                            tutorial_latest_message = 0x124;
                                            goto LAB_0026ed3d;
                                          }
                                        }
                                        poVar8 = level->objects[u.ux][u.uy];
                                        if (poVar8 != (obj *)0x0) {
                                          do {
                                            uVar10 = (ushort)poVar8->otyp - 0xda;
                                            if (((uVar10 < 4) && (uVar10 != 2)) &&
                                               (pl_tutorial[0x6c] < '\x01' && flags.tutorial != '\0'
                                               )) goto LAB_0026f94a;
                                            poVar8 = (poVar8->v).v_nexthere;
                                          } while (poVar8 != (obj *)0x0);
                                        }
                                        if (tutorial_last_combat < 6) {
                                          return;
                                        }
                                        if ((0 < check_tutorial_command_message) &&
                                           (bVar5 = check_tutorial_message
                                                              (check_tutorial_command_message),
                                           bVar5 != '\0')) {
                                          return;
                                        }
                                        if (((moves < 10) || (flags.tutorial == '\0')) ||
                                           ('\0' < pl_tutorial[0x4f])) {
                                          if (((moves < 0x1e) || (flags.tutorial == '\0')) ||
                                             ('\0' < pl_tutorial[0x50])) {
                                            if (moves < 0x3c) {
                                              if (moves < 100) {
                                                return;
                                              }
                                            }
                                            else {
                                              bVar14 = flags.tutorial != '\0';
                                              bVar13 = pl_tutorial[0x51] < '\x01';
                                              if (bVar13 && bVar14) {
                                                pl_tutorial[0x51] = '\x01';
                                                tutorial_latest_message = 0x11a;
                                                com_pager(0x11a);
                                              }
                                              if (bVar13 && bVar14 || moves < 100) {
                                                return;
                                              }
                                            }
                                            bVar14 = flags.tutorial != '\0';
                                            bVar13 = pl_tutorial[0x52] < '\x01';
                                            if (bVar13 && bVar14) {
                                              pl_tutorial[0x52] = '\x01';
                                              tutorial_latest_message = 0x11b;
                                              com_pager(0x11b);
                                            }
                                            if (((bVar13 && bVar14 || moves < 0x96) ||
                                                (flags.tutorial == '\0')) ||
                                               ('\0' < pl_tutorial[0x53])) {
                                              return;
                                            }
                                            pl_tutorial[0x53] = '\x01';
                                            tutorial_latest_message = 0x11c;
                                          }
                                          else {
                                            pl_tutorial[0x50] = '\x01';
                                            tutorial_latest_message = 0x119;
                                          }
                                        }
                                        else {
                                          pl_tutorial[0x4f] = '\x01';
                                          tutorial_latest_message = 0x118;
                                        }
                                      }
                                    }
                                    else {
                                      pl_tutorial[0x9f] = '\x01';
                                      tutorial_latest_message = 0x168;
                                    }
                                  }
                                  else {
                                    pl_tutorial[0x87] = '\x01';
                                    tutorial_latest_message = 0x150;
                                  }
                                }
                                else {
                                  pl_tutorial[0x88] = '\x01';
                                  tutorial_latest_message = 0x151;
                                }
                              }
                              else {
                                pl_tutorial[0x8d] = '\x01';
                                tutorial_latest_message = 0x156;
                              }
                            }
                            else {
                              pl_tutorial[0x84] = '\x01';
                              tutorial_latest_message = 0x14d;
                            }
                          }
                        }
                        else {
                          pl_tutorial[0x81] = '\x01';
                          tutorial_latest_message = 0x14a;
                        }
                      }
                      else {
                        pl_tutorial[0x80] = '\x01';
                        tutorial_latest_message = 0x149;
                      }
                    }
                    else {
                      pl_tutorial[0x85] = '\x01';
                      tutorial_latest_message = 0x14e;
                    }
                  }
                  else {
                    pl_tutorial[0x4a] = '\x01';
                    tutorial_latest_message = 0x113;
                  }
                }
                else {
                  pl_tutorial[0x7b] = '\x01';
                  tutorial_latest_message = 0x144;
                }
              }
              else {
                pl_tutorial[0x83] = '\x01';
                tutorial_latest_message = 0x14c;
              }
            }
            else {
              pl_tutorial[0x7f] = '\x01';
              tutorial_latest_message = 0x148;
            }
          }
          else {
            pl_tutorial[0x78] = '\x01';
            tutorial_latest_message = 0x141;
          }
        }
        else {
          pl_tutorial[0x77] = '\x01';
          tutorial_latest_message = 0x140;
        }
      }
      else {
        pl_tutorial[0x8c] = '\x01';
        tutorial_latest_message = 0x155;
      }
    }
    else {
      pl_tutorial[0x8b] = '\x01';
      tutorial_latest_message = 0x154;
    }
  }
LAB_0026ed3d:
  com_pager(tutorial_latest_message);
  return;
LAB_0026f94a:
  pl_tutorial[0x6c] = '\x01';
  tutorial_latest_message = 0x135;
  goto LAB_0026ed3d;
}

Assistant:

void maybe_tutorial(void)
{
	int old_tutorial_last_combat;
	int i;
	const struct monst *mtmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Check to see if any tutorial triggers have occured.
	   Stop checking once one message is output. */

	/* Welcome message: show immediately */
	if (check_tutorial_message(QT_T_WELCOME)) return;

	/* Check surroundings; these only occur if at least 3 turns
	   have elapsed, to avoid overwhelming the player early on. */
	if (moves > 3) {
	    int dx, dy;
	    int monnum = -1;
	    for (dx = -1; dx <= 1; dx++) {
		for (dy = -1; dy <= 1; dy++) {
		    if (isok(u.ux + dx, u.uy + dy)) {
			int lx = u.ux + dx;
			int ly = u.uy + dy;
			const struct rm *l = &level->locations[lx][ly];

			/* Terrain checks */
			if (check_tutorial_location(lx, ly, FALSE)) return;

			/* Adjacent invisible monsters */
			if (l->mem_invis)
			    if (check_tutorial_message(QT_T_LOOK_INVISIBLE)) return;

			/* More than one of the same monster adjacent */
			if (dbuf_get_mon(lx, ly)) {
			    if (monnum == (dbuf_get_mon(lx, ly) - 1))
				if (check_tutorial_message(QT_T_CALLMONSTER)) return;
			    monnum = dbuf_get_mon(lx, ly) - 1;
			}
		    }
		}
	    }
	}

	/* Check to see if we're in combat. */
	tutorial_last_combat++;
	old_tutorial_last_combat = tutorial_last_combat;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (!DEADMONSTER(mtmp) && cansee(mtmp->mx, mtmp->my) && !mtmp->mtame)
		tutorial_last_combat = 0;

	/* Ambient messages that only come up during combat, and only one
	   message per combat */
	if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
	    if (u.uz.dlevel >= 3)
		if (flags.elbereth_enabled &&
		    check_tutorial_message(QT_T_ELBERETH)) return;
	    for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++) {
		if (spellid(i) == SPE_FORCE_BOLT)
		    if (check_tutorial_message(QT_T_SPELLS)) return;
	    }
	    if (check_tutorial_message(QT_T_MELEE)) return;
	}

	/* Events! */

	if (spellid(1)) {
	    if ((uarm && is_metallic(uarm)) ||
		(uarms && !Role_if(PM_PRIEST)) || /* priests start with shields */
		(uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE) ||
		(uarmg && is_metallic(uarmg)) ||
		(uarmf && is_metallic(uarmf)))
		if (check_tutorial_message(QT_T_CASTER_ARMOR)) return;
	}

	if (uwep && uwep != &zeroobj && weapon_dam_bonus(uwep) < 0 && !u.twoweap)
	    if (check_tutorial_message(QT_T_WEAPON_SKILL)) return;
	if (u.ulevel >= 2)
	    if (check_tutorial_message(QT_T_LEVELUP)) return;
	if (u.ulevel >= 3)
	    if (check_tutorial_message(QT_T_RANKUP)) return;
	{
	    int incdec = 0;
	    boolean firstturn = tutorial_old_attribs.a[0] == 0;
	    for (i = 0; i < A_MAX; i++) {
		if (u.acurr.a[i] > tutorial_old_attribs.a[i]) incdec = 1;
		if (u.acurr.a[i] < tutorial_old_attribs.a[i]) incdec = -1;
		tutorial_old_attribs.a[i] = u.acurr.a[i];
	    }
	    if (!firstturn) {
		if (incdec > 0)
		    if (check_tutorial_message(QT_T_ABILUP)) return;
		if (incdec < 0)
		    if (check_tutorial_message(QT_T_ABILDOWN)) return;
	    }
	}
	if (u.uac < tutorial_old_ac && tutorial_old_ac != TUTORIAL_IMPOSSIBLE_AC)
	    if (check_tutorial_message(QT_T_ACIMPROVED)) return;
	tutorial_old_ac = u.uac;

	if (Confusion || Sick || Blind || Stunned || Hallucination || Slimed)
	    if (check_tutorial_message(QT_T_STATUS)) return;

	if (u.uz.dlevel >= 2)
	    if (check_tutorial_message(QT_T_DLEVELCHANGE)) return;
	if (u.uz.dlevel >= 10)
	    if (check_tutorial_message(QT_T_DGN_OVERVIEW)) return;

	if (u.uhp < u.uhpmax)
	    if (check_tutorial_message(QT_T_DAMAGED)) return;
	if (u.uen < u.uenmax)
	    if (check_tutorial_message(QT_T_PWUSED)) return;
	if (u.uen < 5 && u.uenmax > 10)
	    if (check_tutorial_message(QT_T_PWEMPTY)) return;

	if (u.umonster != u.umonnum)
	    if (check_tutorial_message(QT_T_POLYSELF)) return;

	if (u.uexp > 0)
	    if (check_tutorial_message(QT_T_GAINEDEXP)) return;

	if (u.uhs >= HUNGRY)
	    if (check_tutorial_message(QT_T_HUNGER)) return;
	if (u.uhs <= SATIATED)
	    if (check_tutorial_message(QT_T_SATIATION)) return;

	if (can_advance_something())
	    if (check_tutorial_message(QT_T_ENHANCE)) return;

	if (u.uswallow)
	    if (check_tutorial_message(QT_T_ENGULFED)) return;

	if (near_capacity() > UNENCUMBERED)
	    if (check_tutorial_message(QT_T_BURDEN)) return;

	if (in_trouble() > 0 && can_pray(0) &&
	    !IS_ALTAR(level->locations[u.ux][u.uy].typ))
	    if (check_tutorial_message(QT_T_MAJORTROUBLE)) return;

	if (inside_shop(level, u.ux, u.uy))
	    if (check_tutorial_message(QT_T_SHOPENTRY)) return;

	if (u.uz.dnum == mines_dnum)
	    if (check_tutorial_message(QT_T_MINES)) return;
	if (u.uz.dnum == sokoban_dnum)
	    if (check_tutorial_message(QT_T_SOKOBAN)) return;
	if (check_tutorial_command_message == QT_T_FIRE)
	    if (check_tutorial_message(QT_T_FIRE)) return;

	/* Item-dependent events. */

	{
	    int projectile_groups = 0;
	    int launcher_groups = 0;
	    struct obj *otmp;

	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->bknown && otmp->cursed)
		    if (check_tutorial_message(QT_T_EQUIPCURSE)) return;

		if (otmp->oartifact)
		    if (check_tutorial_message(QT_T_ARTIFACT)) return;

		if (otmp->unpaid)
		    if (check_tutorial_message(QT_T_SHOPBUY)) return;

		if (!objects[otmp->otyp].oc_name_known) {
		    switch (objects[otmp->otyp].oc_class) {
		    case POTION_CLASS:
			if (otmp->otyp == POT_WATER) break;
			/* fall through */
		    case SCROLL_CLASS:
			if (otmp->otyp == SCR_BLANK_PAPER) break;
			/* fall through */
		    case WAND_CLASS:
		    case SPBOOK_CLASS:
			if (otmp->otyp == SPE_BLANK_PAPER) break;
			if (otmp->otyp == SPE_BOOK_OF_THE_DEAD) break;
			/* fall through */
		    case RING_CLASS:
		    case AMULET_CLASS:
			if (check_tutorial_message(QT_T_RANDAPPEARANCE)) return;
			break;
		    default:
			break;
		    }
		}

		/* Containers; minor spoiler here, in that it doesn't trigger
		   off a bag of tricks and a savvy player might notice that, but
		   that's not a freebie I'm worried about. */
		switch (otmp->otyp) {
		case SACK:
		    /* starting inventory for arcs/rogues, and we don't want to
		       give the message until a second container's listed */
		    if (Role_if(PM_ARCHEOLOGIST)) break;
		    if (Role_if(PM_ROGUE)) break;
		    /* otherwise fall through */
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		case OILSKIN_SACK:
		case BAG_OF_HOLDING:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}

		/* Requiring a specific item during combat... */
		if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
		    switch (otmp->otyp) {
		    /* Projectiles. */
		    case ARROW:
		    case ELVEN_ARROW:
		    case ORCISH_ARROW:
		    case SILVER_ARROW:
		    case YA:
			projectile_groups |= 0x1;
			break;
		    case CROSSBOW_BOLT:
			projectile_groups |= 0x2;
			break;
		    case FLINT:
		    case ROCK:
			projectile_groups |= 0x4;
			break;

		    /* Launchers. */
		    case BOW:
		    case ELVEN_BOW:
		    case ORCISH_BOW:
		    case YUMI:
			launcher_groups |= 0x1;
			break;
		    case CROSSBOW:
			launcher_groups |= 0x2;
			break;
		    case SLING:
			launcher_groups |= 0x4;
			break;

		    /* Thrown weapons. Don't count our wielded weapon in this. */
		    case DART:
		    case SHURIKEN:
		    case BOOMERANG:
		    case SPEAR:
		    case ELVEN_SPEAR:
		    case ORCISH_SPEAR:
		    case DWARVISH_SPEAR:
		    case JAVELIN:
		    case DAGGER:
		    case ELVEN_DAGGER:
		    case ORCISH_DAGGER:
		    case SILVER_DAGGER:
			if (otmp == uwep) break;
			if (check_tutorial_message(QT_T_THROWNWEAPONS)) return;
			break;

		    default:
			break;
		    }
		}
	    }
	    if (projectile_groups & launcher_groups)
		if (check_tutorial_message(QT_T_PROJECTILES)) return;
	}

	/* Items on the current square. */
	{
	    struct obj *otmp;
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		switch (otmp->otyp) {
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}
	    }
	}

	/* Ambient messages that only come up outside combat */
	if (tutorial_last_combat > 5) {
	    if (check_tutorial_command_message > 0)
		if (check_tutorial_message(check_tutorial_command_message)) return;
	    if (moves >= 10)
		if (check_tutorial_message(QT_T_VIEWTUTORIAL)) return;
	    if (moves >= 30)
		if (check_tutorial_message(QT_T_CHECK_ITEMS)) return;
	    if (moves >= 60)
		if (check_tutorial_message(QT_T_OBJECTIVE)) return;
	    if (moves >= 100)
		if (check_tutorial_message(QT_T_SAVELOAD)) return;
	    if (moves >= 150)
		if (check_tutorial_message(QT_T_MESSAGERECALL)) return;
	}
}